

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

void Sfm_NtkDeleteObj_rec(Sfm_Ntk_t *p,int iNode)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  
  iVar2 = Sfm_ObjFanoutNum(p,iNode);
  if ((iVar2 < 1) && (p->nPis <= iNode)) {
    cVar1 = Vec_StrEntry(p->vFixed,iNode);
    if (cVar1 == '\0') {
      if ((p->nPis <= iNode) && (p->nPos + iNode < p->nObjs)) {
        iVar2 = 0;
        while( true ) {
          iVar3 = Sfm_ObjFaninNum(p,iNode);
          if (iVar3 <= iVar2) {
            pVVar5 = Vec_WecEntry(&p->vFanins,iNode);
            pVVar5->nSize = 0;
            Vec_WrdWriteEntry(p->vTruths,iNode,0);
            return;
          }
          iVar3 = Sfm_ObjFanin(p,iNode,iVar2);
          pVVar5 = Vec_WecEntry(&p->vFanouts,iVar3);
          iVar4 = Vec_IntRemove(pVVar5,iNode);
          if (iVar4 == 0) break;
          Sfm_NtkDeleteObj_rec(p,iVar3);
          iVar2 = iVar2 + 1;
        }
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmNtk.c"
                      ,0x120,"void Sfm_NtkDeleteObj_rec(Sfm_Ntk_t *, int)");
      }
      __assert_fail("Sfm_ObjIsNode(p, iNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmNtk.c"
                    ,0x11d,"void Sfm_NtkDeleteObj_rec(Sfm_Ntk_t *, int)");
    }
  }
  return;
}

Assistant:

void Sfm_NtkDeleteObj_rec( Sfm_Ntk_t * p, int iNode )
{
    int i, iFanin;
    if ( Sfm_ObjFanoutNum(p, iNode) > 0 || Sfm_ObjIsPi(p, iNode) || Sfm_ObjIsFixed(p, iNode) )
        return;
    assert( Sfm_ObjIsNode(p, iNode) );
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
    {
        int RetValue = Vec_IntRemove( Sfm_ObjFoArray(p, iFanin), iNode );  assert( RetValue );
        Sfm_NtkDeleteObj_rec( p, iFanin );
    }
    Vec_IntClear( Sfm_ObjFiArray(p, iNode) );
    Vec_WrdWriteEntry( p->vTruths, iNode, (word)0 );
}